

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloadsave.cpp
# Opt level: O0

void load0(char *filename)

{
  double dVar1;
  byte bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  float fVar8;
  Am_Value local_2e8;
  Am_String local_2d8 [8];
  Am_String h;
  undefined1 local_2b8 [7];
  char g;
  double local_2a8;
  double f;
  float local_28c;
  undefined1 local_288 [4];
  float e;
  byte local_271;
  undefined1 local_270 [7];
  bool d;
  byte local_259;
  undefined1 local_258 [7];
  bool c;
  long local_248;
  long b;
  int local_22c;
  undefined4 local_228;
  int a;
  long local_218;
  ifstream in_file;
  char *filename_local;
  
  std::ifstream::ifstream(&local_218,filename,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if ((bVar2 & 1) == 0) {
    Am_Load_Save_Context::Reset();
    Am_Load_Save_Context::Load((istream *)&b);
    iVar5 = Am_Value::operator_cast_to_int((Am_Value *)&b);
    Am_Value::~Am_Value((Am_Value *)&b);
    local_22c = iVar5;
    Am_Load_Save_Context::Load((istream *)local_258);
    lVar6 = Am_Value::operator_cast_to_long((Am_Value *)local_258);
    Am_Value::~Am_Value((Am_Value *)local_258);
    local_248 = lVar6;
    Am_Load_Save_Context::Load((istream *)local_270);
    bVar3 = Am_Value::operator_cast_to_bool((Am_Value *)local_270);
    Am_Value::~Am_Value((Am_Value *)local_270);
    local_259 = bVar3;
    Am_Load_Save_Context::Load((istream *)local_288);
    bVar3 = Am_Value::operator_cast_to_bool((Am_Value *)local_288);
    Am_Value::~Am_Value((Am_Value *)local_288);
    local_271 = bVar3;
    Am_Load_Save_Context::Load((istream *)&f);
    fVar8 = Am_Value::operator_cast_to_float((Am_Value *)&f);
    Am_Value::~Am_Value((Am_Value *)&f);
    local_28c = fVar8;
    Am_Load_Save_Context::Load((istream *)local_2b8);
    dVar1 = Am_Value::operator_cast_to_double((Am_Value *)local_2b8);
    Am_Value::~Am_Value((Am_Value *)local_2b8);
    local_2a8 = dVar1;
    Am_Load_Save_Context::Load((istream *)&h);
    cVar4 = Am_Value::operator_cast_to_char((Am_Value *)&h);
    Am_Value::~Am_Value((Am_Value *)&h);
    Am_Load_Save_Context::Load((istream *)&local_2e8);
    Am_String::Am_String(local_2d8,(Am_Value *)&local_2e8);
    Am_Value::~Am_Value(&local_2e8);
    if (((((local_22c != 5) || (local_248 != 0x44fc16)) || ((local_259 & 1) == 0)) ||
        (((local_271 & 1) != 0 || (0.0001 <= ABS(local_28c - 54.234))))) ||
       ((0.0001 <= ABS(local_2a8 - 123.344) ||
        ((cVar4 != 'a' ||
         (bVar2 = Am_String::operator==(local_2d8,"Hello this is a test to see what\n happens"),
         (bVar2 & 1) == 0)))))) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Test 0 failed");
      std::ostream::operator<<((ostream *)poVar7,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,"Test 0 okay");
      std::ostream::operator<<((ostream *)poVar7,std::endl<char,std::char_traits<char>>);
    }
    Am_String::~Am_String(local_2d8);
    local_228 = 0;
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"open failed");
    std::ostream::operator<<((ostream *)poVar7,std::endl<char,std::char_traits<char>>);
    local_228 = 1;
  }
  std::ifstream::~ifstream(&local_218);
  return;
}

Assistant:

void
load0(const char *filename)
{
  // open the file
  std::ifstream in_file(filename, std::ios::in);
  if (!in_file) {
    std::cout << "open failed" << std::endl;
    return;
  }

  // reset internal reference counters etc. (should always be done for new stream)
  Am_Default_Load_Save_Context.Reset();

  // read-back with in same order
  int a = Am_Default_Load_Save_Context.Load(in_file);
  long b = Am_Default_Load_Save_Context.Load(in_file);
  bool c = Am_Default_Load_Save_Context.Load(in_file);
  bool d = Am_Default_Load_Save_Context.Load(in_file);
  float e = Am_Default_Load_Save_Context.Load(in_file);
  double f = Am_Default_Load_Save_Context.Load(in_file);
  char g = Am_Default_Load_Save_Context.Load(in_file);
  Am_String h = Am_Default_Load_Save_Context.Load(in_file);

  // now do the check, that we read back the correct values
  if (a == 5 && b == 4520982 && c && !d && (fabs(e - 54.234) < 0.0001) &&
      (fabs(f - 123.344) < 0.0001) && g == 'a' &&
      h == "Hello this is a test to see what\n happens") {
    // everything is ok
    std::cout << "Test 0 okay" << std::endl;
  } else {
    // ups, there is a problem
    std::cout << "Test 0 failed" << std::endl;
  }
}